

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

PyObject * PyInit_cmake_example(void)

{
  module_ mVar1;
  int iVar2;
  char *__s1;
  module_ m;
  cpp_function func;
  handle local_48;
  object local_40;
  accessor<pybind11::detail::accessor_policies::str_attr> local_38;
  
  __s1 = (char *)Py_GetVersion();
  iVar2 = strncmp(__s1,"3.10",4);
  if ((iVar2 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::detail::get_internals();
    pybind11::module_::create_extension_module
              (&m,"cmake_example",(char *)0x0,&pybind11_module_def_cmake_example);
    local_38.obj.m_ptr = (PyObject *)m.super_object.super_handle.m_ptr;
    local_38.key = "__doc__";
    local_38.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_38,
               (char (*) [205])
               "\n        Pybind11 example plugin\n        -----------------------\n\n        .. currentmodule:: cmake_example\n\n        .. autosummary::\n           :toctree: _generate\n\n           add\n           subtract\n    "
              );
    pybind11::object::~object(&local_38.cache);
    local_38._0_8_ = add;
    pybind11::module_::def<int(*)(int,int),char[86]>
              (&m,"add",(type **)&local_38,
               (char (*) [86])
               "\n        Add two numbers\n\n        Some other explanation about the add function.\n    "
              );
    mVar1 = m;
    local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)&local_48,(handle)m.super_object.super_handle.m_ptr,"subtract",
                      (PyObject *)&_Py_NoneStruct);
    func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
    *(code **)(local_38._0_8_ + 0x30) =
         pybind11::cpp_function::
         initialize<pybind11_init_cmake_example(pybind11::module_&)::$_0,int,int,int,pybind11::name,pybind11::scope,pybind11::sibling,char[96]>(pybind11_init_cmake_example(pybind11::module_&)::$_0&&,int(*)(int,int),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const(&)[96])
         ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    *(undefined2 *)(local_38._0_8_ + 0x5c) = 2;
    *(code *)(local_38._0_8_ + 0x59) = (code)((byte)*(code *)(local_38._0_8_ + 0x59) & 0x9f);
    *(char **)local_38._0_8_ = "subtract";
    *(object *)(local_38._0_8_ + 0x68) = mVar1.super_object.super_handle.m_ptr;
    *(PyObject **)(local_38._0_8_ + 0x70) = local_48.m_ptr;
    *(char **)(local_38._0_8_ + 8) =
         "\n        Subtract two numbers\n\n        Some other explanation about the subtract function.\n    "
    ;
    pybind11::cpp_function::initialize_generic
              (&func,(unique_function_record *)&local_38,"({int}, {int}) -> int",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_cmake_example(pybind11::module_&)::$_0,int,int,int,pybind11::name,pybind11::scope,pybind11::sibling,char[96]>(pybind11_init_cmake_example(pybind11::module_&)::$_0&&,int(*)(int,int),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const&[])
                ::types,2);
    std::
    unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   *)&local_38);
    pybind11::object::~object((object *)&local_48);
    pybind11::object::~object(&local_40);
    pybind11::module_::add_object
              (&m,"subtract",(handle)func.super_function.super_object.super_handle.m_ptr,true);
    pybind11::object::~object((object *)&func);
    local_38.obj.m_ptr = (PyObject *)m.super_object.super_handle.m_ptr;
    local_38.key = "__version__";
    local_38.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_38,(char (*) [1])0x115e12);
    pybind11::object::~object(&local_38.cache);
    pybind11::object::~object(&m.super_object);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_MODULE(cmake_example, m) {
    m.doc() = R"pbdoc(
        Pybind11 example plugin
        -----------------------

        .. currentmodule:: cmake_example

        .. autosummary::
           :toctree: _generate

           add
           subtract
    )pbdoc";

    m.def("add", &add, R"pbdoc(
        Add two numbers

        Some other explanation about the add function.
    )pbdoc");

    m.def("subtract", [](int i, int j) { return i - j; }, R"pbdoc(
        Subtract two numbers

        Some other explanation about the subtract function.
    )pbdoc");

#ifdef VERSION_INFO
    m.attr("__version__") = MACRO_STRINGIFY(VERSION_INFO);
#else
    m.attr("__version__") = "dev";
#endif
}